

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_time_pc.c
# Opt level: O2

int32_t gettime(time *tp)

{
  int iVar1;
  timeval now;
  timeval local_18;
  
  iVar1 = gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  if (iVar1 == 0) {
    tp->tv_sec = local_18.tv_sec;
    tp->tv_nsec = local_18.tv_usec * 1000;
  }
  return iVar1;
}

Assistant:

int32_t gettime(struct time *tp)
{
    // WARNING: gettimeofday is subject to clock jitter caused by NTP or other services
    // changing the wall-clock time.
    //
    // Using gettimeofday instead of clock_gettime to simplify the Makefile, so that
    // this code can run on system with glibc versions < 2.17 without having to 
    // link with -lrt because -lrt is not available on OS-X or Windows.
#if 1
    struct timeval now;
    int ret = gettimeofday(&now, NULL);

    if (ret)
    {
        return ret;
    }
    tp->tv_sec = now.tv_sec;
    tp->tv_nsec = now.tv_usec * 1000;

    return 0;
#else
    struct timespec now;
    int32_t ret;

    ret = clock_gettime(CLOCK_MONOTONIC, &now);
    tp->tv_sec = now.tv_sec;
    tp->tv_nsec = now.tv_nsec;
    return ret;
#endif
}